

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_readline(char **lineptr,size_t *n,FILE *stream)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *temp_ptr;
  long lStack_30;
  int temp;
  size_t so_far;
  FILE *stream_local;
  size_t *n_local;
  char **lineptr_local;
  
  lStack_30 = 0;
  if (*lineptr == (char *)0x0) {
    pcVar2 = (char *)malloc(0x80);
    *lineptr = pcVar2;
    if (*lineptr == (char *)0x0) {
      return -0xc;
    }
    *n = 0x80;
  }
  else if (*n == 0) {
    pcVar2 = (char *)realloc(*lineptr,0x80);
    if (pcVar2 == (char *)0x0) {
      return -0xc;
    }
    *lineptr = pcVar2;
    *n = 0x80;
  }
  do {
    iVar1 = fgetc((FILE *)stream);
    if (iVar1 == -1) break;
    if (*n <= lStack_30 + 1U) {
      pcVar2 = (char *)realloc(*lineptr,*n + 0x80);
      if (pcVar2 == (char *)0x0) {
        return -0xc;
      }
      *lineptr = pcVar2;
      *n = *n + 0x80;
    }
    lVar3 = lStack_30 + 1;
    (*lineptr)[lStack_30] = (char)iVar1;
    lStack_30 = lVar3;
  } while (iVar1 != 10);
  (*lineptr)[lStack_30] = '\0';
  return (int)lStack_30;
}

Assistant:

static int conf_readline(char **lineptr, size_t *n, FILE *stream)
{
	size_t so_far = 0;
	int temp;
	char *temp_ptr;

	if (*lineptr == NULL) {
		*lineptr = malloc(128);
		if (*lineptr == NULL)
			return -ENOMEM;

		*n = 128;
	} else if (*n == 0) {
		temp_ptr = realloc(*lineptr, 128);
		if (temp_ptr == NULL)
			return -ENOMEM;

		*lineptr = temp_ptr;
		*n = 128;
	}

	while ((temp = fgetc(stream)) != EOF) {
		/* Need more space? */
		if (so_far + 1 >= *n) {
			temp_ptr = realloc(*lineptr, *n + 128);
			if (temp_ptr == NULL)
				return -ENOMEM;

			*lineptr = temp_ptr;
			*n += 128;
		}

		(*lineptr)[so_far++] = (char)temp;

		if (temp == '\n')
			break;
	}

	(*lineptr)[so_far] = '\0';

	return (int)so_far;
}